

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

uint __thiscall Inline::CountActuals(Inline *this,Instr *callInstr)

{
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  uint uVar7;
  Opnd *this_00;
  
  this_00 = callInstr->m_src2;
  OVar3 = IR::Opnd::GetKind(this_00);
  uVar7 = 0;
  if (OVar3 == OpndKindSym) {
    uVar7 = 0;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1214,"(linkOpnd->IsSymOpnd())","linkOpnd->IsSymOpnd()");
        if (!bVar4) goto LAB_00556585;
        *puVar6 = 0;
      }
      OVar3 = IR::Opnd::GetKind(this_00);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_00556585;
        *puVar6 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_00556585;
        *puVar6 = 0;
      }
      uVar5 = *(uint *)(pp_Var1 + 3);
      if ((uVar5 & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1216,"(sym->m_isSingleDef)","sym->m_isSingleDef");
        if (!bVar4) goto LAB_00556585;
        *puVar6 = 0;
        uVar5 = *(uint *)(pp_Var1 + 3);
      }
      uVar5 = uVar5 & 0x100000;
      if ((uVar5 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_00556585;
        *puVar6 = 0;
        uVar5 = *(uint *)(pp_Var1 + 3) & 0x100000;
      }
      if (uVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1217,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
        if (!bVar4) {
LAB_00556585:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      uVar7 = uVar7 + 1;
      this_00 = *(Opnd **)(pp_Var1[5] + 0x50);
      OVar3 = IR::Opnd::GetKind(this_00);
    } while (OVar3 == OpndKindSym);
  }
  return uVar7;
}

Assistant:

uint Inline::CountActuals(IR::Instr *callInstr)
{
    IR::Opnd *linkOpnd = callInstr->GetSrc2();
    uint actualCount = 0;
    if (linkOpnd->IsSymOpnd())
    {
        IR::Instr *argInstr;
        do
        {
            Assert(linkOpnd->IsSymOpnd());
            StackSym *sym = linkOpnd->AsSymOpnd()->m_sym->AsStackSym();
            Assert(sym->m_isSingleDef);
            Assert(sym->IsArgSlotSym());
            argInstr = sym->m_instrDef;
            ++actualCount;
            linkOpnd = argInstr->GetSrc2();
        }
        while (linkOpnd->IsSymOpnd());
    }
    return actualCount;
}